

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
             *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
  pVar1;
  long lVar2;
  ulong uVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
  pVar4;
  ulong uVar5;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
  *ppVar6;
  ulong uVar7;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
  pVar8;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
  *ppVar9;
  long lVar10;
  
  lVar2 = *(long *)(this + 0x10);
  ppVar6 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
            *)(it->super_truncating_iterator_base<char_*>).out_;
  uVar3 = (it->super_truncating_iterator_base<char_*>).limit_;
  uVar5 = (it->super_truncating_iterator_base<char_*>).count_;
  pVar8 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
           )it->blackhole_;
  if (lVar2 != 0) {
    if (0 < lVar2) {
      ppVar9 = *(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                 **)(this + 8);
      lVar10 = lVar2 + 1;
      uVar7 = uVar5;
      do {
        pVar1 = *ppVar9;
        if (uVar7 < uVar3) {
          *ppVar6 = *ppVar9;
          ppVar6 = ppVar6 + 1;
          pVar1 = pVar8;
        }
        pVar8 = pVar1;
        uVar7 = uVar7 + 1;
        ppVar9 = ppVar9 + 1;
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
      uVar5 = uVar5 + lVar2;
    }
    (it->super_truncating_iterator_base<char_*>).out_ = (char *)ppVar6;
    (it->super_truncating_iterator_base<char_*>).limit_ = uVar3;
    (it->super_truncating_iterator_base<char_*>).count_ = uVar5;
    it->blackhole_ = (value_type)pVar8;
  }
  lVar2 = *(long *)(this + 0x20);
  if (lVar2 != 0) {
    pVar1 = this[0x18];
    lVar10 = lVar2;
    uVar7 = uVar5;
    do {
      pVar4 = pVar1;
      if (uVar7 < uVar3) {
        *ppVar6 = pVar1;
        ppVar6 = ppVar6 + 1;
        pVar4 = pVar8;
      }
      pVar8 = pVar4;
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    uVar5 = uVar5 + lVar2;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = (char *)ppVar6;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar3;
  (it->super_truncating_iterator_base<char_*>).count_ = uVar5;
  it->blackhole_ = (value_type)pVar8;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
            ((bin_writer<1> *)(this + 0x28),it);
  return;
}

Assistant:

inline T *make_checked(T *p, std::size_t) { return p; }